

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

bool is_tracked_signal(QMetaMethod *signal)

{
  bool bVar1;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  QMetaMethod *in_stack_fffffffffffffff0;
  
  if (is_tracked_signal(QMetaMethod_const&)::sigs == '\0') {
    iVar2 = __cxa_guard_acquire(&is_tracked_signal(QMetaMethod_const&)::sigs);
    if (iVar2 != 0) {
      is_tracked_signal(QMetaMethod_const&)::$_0::__0((anon_struct_32_2_a79f9873 *)signal);
      __cxa_guard_release(&is_tracked_signal(QMetaMethod_const&)::sigs);
    }
  }
  bVar1 = operator==(in_stack_fffffffffffffff0,
                     (QMetaMethod *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffe8);
  if (!bVar1) {
    bVar1 = operator==(in_stack_fffffffffffffff0,
                       (QMetaMethod *)CONCAT44(in_stack_ffffffffffffffec,iVar2));
    iVar2 = (uint)bVar1 << 0x18;
  }
  return SUB41((uint)iVar2 >> 0x18,0);
}

Assistant:

static bool is_tracked_signal(const QMetaMethod &signal)
{
    // dynamic initialization: minimize the number of guard variables:
    static const struct {
        QMetaMethod readyReadSignal = QMetaMethod::fromSignal(&QBuffer::readyRead);
        QMetaMethod bytesWrittenSignal = QMetaMethod::fromSignal(&QBuffer::bytesWritten);
    } sigs;
    return signal == sigs.readyReadSignal || signal == sigs.bytesWrittenSignal;
}